

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_update2_cc(DisasContext *s)

{
  TCGContext *tcg_ctx_00;
  TCGContext *tcg_ctx;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  tcg_gen_mov_i64_x86_64(tcg_ctx_00,tcg_ctx_00->cpu_cc_src,s->T1);
  tcg_gen_mov_i64_x86_64(tcg_ctx_00,tcg_ctx_00->cpu_cc_dst,s->T0);
  return;
}

Assistant:

static void gen_op_update2_cc(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src, s->T1);
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_dst, s->T0);
}